

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall mp::NLFeeder_Easy::FillColSizes(NLFeeder_Easy *this)

{
  int *piVar1;
  int *piVar2;
  pointer piVar3;
  long lVar4;
  size_t sVar5;
  
  sVar5 = (this->nlme_).A_.num_nz_;
  piVar2 = (this->nlme_).A_.index_;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->col_sizes_,(long)(this->nlme_).vars_.num_col_);
  if (sVar5 != 0) {
    piVar3 = (this->col_sizes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lVar4 = sVar5 - 1;
      sVar5 = sVar5 - 1;
      piVar1 = piVar3 + piVar2[lVar4];
      *piVar1 = *piVar1 + 1;
    } while (sVar5 != 0);
  }
  return;
}

Assistant:

void FillColSizes() {
    auto A = NLME().GetA();
    col_sizes_.resize(NLME().NumCols());
    for (auto pos=A.num_nz_; pos--; )
      ++col_sizes_[A.index_[pos]];
  }